

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_function.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableBindReplace(duckdb *this,ClientContext *context,TableFunctionBindInput *input)

{
  pointer pVVar1;
  pointer pVVar2;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var3;
  bool bVar4;
  reference pvVar5;
  size_t sVar6;
  long *plVar7;
  undefined8 *puVar8;
  vector<duckdb::Value,_true> *pvVar9;
  const_reference pvVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  BinderException *this_00;
  InvalidInputException *pIVar12;
  size_type *psVar13;
  long *plVar14;
  pointer pVVar15;
  char *__s;
  size_type __n;
  string union_all_clause;
  string child;
  QualifiedName qualified_name;
  string query;
  string from_path;
  string by_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_1a0;
  QualifiedName local_180;
  string local_120;
  QualifiedName local_100;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_60;
  ClientContext *local_58;
  string local_50;
  
  pvVar9 = input->inputs;
  pVVar2 = (pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar1 = (pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pVVar15 = pVVar1; local_58 = context, pVVar15 != pVVar2; pVVar15 = pVVar15 + 1) {
    if (pVVar15->is_null == true) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Cannot use NULL as function argument","");
      BinderException::BinderException(this_00,&local_180.catalog);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  __s = anon_var_dwarf_4ed193b + 9;
  local_60._M_head_impl = (TableRef *)this;
  if (((long)pVVar2 - (long)pVVar1 == 0x80) &&
     (pvVar5 = vector<duckdb::Value,_true>::operator[](pvVar9,1), (pvVar5->type_).id_ == BOOLEAN)) {
    pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,1);
    bVar4 = Value::GetValue<bool>(pvVar5);
    __s = anon_var_dwarf_4ed193b + 9;
    if (bVar4) {
      __s = "BY NAME ";
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  sVar6 = strlen(__s);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar6);
  pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  if ((pvVar5->type_).id_ == VARCHAR) {
    pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    Value::ToString_abi_cxx11_(&local_100.catalog,pvVar5);
    QualifiedName::Parse(&local_180,&local_100.catalog);
    QualifiedName::ToString_abi_cxx11_(&local_1a0,&local_180);
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1dceca5);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar11) {
      local_1b0._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1b0._8_8_ = plVar7[3];
      local_1c0 = &local_1b0;
    }
    else {
      local_1b0._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7;
    }
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1c0);
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.name._M_dataplus._M_p != &local_180.name.field_2) {
      operator_delete(local_180.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.schema._M_dataplus._M_p != &local_180.schema.field_2) {
      operator_delete(local_180.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    paVar11 = &local_100.catalog.field_2;
    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100.catalog._M_dataplus._M_p;
  }
  else {
    pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    LogicalType::LogicalType((LogicalType *)&local_100,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_180,(LogicalType *)&local_100);
    bVar4 = LogicalType::operator==(&pvVar5->type_,(LogicalType *)&local_180);
    LogicalType::~LogicalType((LogicalType *)&local_180);
    LogicalType::~LogicalType((LogicalType *)&local_100);
    if (!bVar4) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Expected a table or a list with tables as input","");
      InvalidInputException::InvalidInputException(pIVar12,(string *)&local_180);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::operator+(&local_180.catalog," UNION ALL ",&local_80);
    puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_180);
    local_1c0 = &local_1b0;
    psVar13 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1b0._M_allocated_capacity = *psVar13;
      local_1b0._8_8_ = puVar8[3];
    }
    else {
      local_1b0._M_allocated_capacity = *psVar13;
      local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
    }
    *puVar8 = psVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    pvVar5 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    pvVar9 = ListValue::GetChildren(pvVar5);
    if ((pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Input list is empty","");
      InvalidInputException::InvalidInputException(pIVar12,(string *)&local_180);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar10 = vector<duckdb::Value,_true>::operator[](pvVar9,0);
    Value::ToString_abi_cxx11_(&local_100.catalog,pvVar10);
    QualifiedName::Parse(&local_180,&local_100.catalog);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.catalog._M_dataplus._M_p != &local_100.catalog.field_2) {
      operator_delete(local_100.catalog._M_dataplus._M_p);
    }
    QualifiedName::ToString_abi_cxx11_(&local_1a0,&local_180);
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1dceca5);
    local_100.catalog._M_dataplus._M_p = (pointer)&local_100.catalog.field_2;
    psVar13 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_100.catalog.field_2._M_allocated_capacity = *psVar13;
      local_100.catalog.field_2._8_8_ = puVar8[3];
    }
    else {
      local_100.catalog.field_2._M_allocated_capacity = *psVar13;
      local_100.catalog._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_100.catalog._M_string_length = puVar8[1];
    *puVar8 = psVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100.catalog._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.catalog._M_dataplus._M_p != &local_100.catalog.field_2) {
      operator_delete(local_100.catalog._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (0x40 < (ulong)((long)(pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      __n = 1;
      do {
        pvVar10 = vector<duckdb::Value,_true>::operator[](pvVar9,__n);
        Value::ToString_abi_cxx11_(&local_1a0,pvVar10);
        QualifiedName::Parse(&local_100,&local_1a0);
        QualifiedName::ToString_abi_cxx11_(&local_50,&local_100);
        plVar7 = (long *)::std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_1c0);
        plVar14 = plVar7 + 2;
        if ((long *)*plVar7 == plVar14) {
          local_90 = *plVar14;
          lStack_88 = plVar7[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar14;
          local_a0 = (long *)*plVar7;
        }
        local_98 = plVar7[1];
        *plVar7 = (long)plVar14;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.name._M_dataplus._M_p != &local_100.name.field_2) {
          operator_delete(local_100.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.schema._M_dataplus._M_p != &local_100.schema.field_2) {
          operator_delete(local_100.schema._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.catalog._M_dataplus._M_p != &local_100.catalog.field_2) {
          operator_delete(local_100.catalog._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(pvVar9->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar9->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.name._M_dataplus._M_p != &local_180.name.field_2) {
      operator_delete(local_180.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.schema._M_dataplus._M_p != &local_180.schema.field_2) {
      operator_delete(local_180.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    paVar11 = &local_1b0;
  }
  if (local_1c0 != paVar11) {
    operator_delete(local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  ClientContext::GetParserOptions((ParserOptions *)&local_100,local_58);
  paVar11 = &local_180.catalog.field_2;
  local_180.catalog._M_dataplus._M_p = (pointer)paVar11;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Expected a table or a list with tables as input","");
  ParseSubquery((duckdb *)&local_80,&local_120,(ParserOptions *)&local_100,&local_180.catalog);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.catalog._M_dataplus._M_p != paVar11) {
    operator_delete(local_180.catalog._M_dataplus._M_p);
  }
  _Var3._M_head_impl = local_60._M_head_impl;
  (local_60._M_head_impl)->_vptr_TableRef = (_func_int **)local_80._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         _Var3._M_head_impl;
}

Assistant:

static unique_ptr<TableRef> TableBindReplace(ClientContext &context, TableFunctionBindInput &input) {
	auto query = UnionTablesQuery(input);
	auto subquery_ref =
	    ParseSubquery(query, context.GetParserOptions(), "Expected a table or a list with tables as input");
	return std::move(subquery_ref);
}